

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

ER __thiscall
slang::ast::ExpressionStatement::evalImpl(ExpressionStatement *this,EvalContext *context)

{
  SourceRange *pSVar1;
  bool bVar2;
  SubroutineKind SVar3;
  CallExpression *pCVar4;
  Diagnostic *this_00;
  ConstantValue local_70;
  string_view local_48;
  SourceLocation local_38;
  SourceLocation local_30;
  undefined4 local_24;
  EvalContext *local_20;
  EvalContext *context_local;
  ExpressionStatement *this_local;
  
  local_20 = context;
  context_local = (EvalContext *)this;
  if (this->expr->kind == Call) {
    pCVar4 = Expression::as<slang::ast::CallExpression>(this->expr);
    bVar2 = CallExpression::isSystemCall(pCVar4);
    if (bVar2) {
      pCVar4 = Expression::as<slang::ast::CallExpression>(this->expr);
      SVar3 = CallExpression::getSubroutineKind(pCVar4);
      if (SVar3 == Task) {
        local_24 = 0x26000c;
        pSVar1 = &this->expr->sourceRange;
        local_38 = pSVar1->startLoc;
        local_30 = (this->expr->sourceRange).endLoc;
        this_00 = EvalContext::addDiag(local_20,(DiagCode)0x26000c,*pSVar1);
        pCVar4 = Expression::as<slang::ast::CallExpression>(this->expr);
        local_48 = CallExpression::getSubroutineName(pCVar4);
        Diagnostic::operator<<(this_00,local_48);
        return Success;
      }
    }
  }
  Expression::eval(&local_70,this->expr,local_20);
  bVar2 = slang::ConstantValue::operator_cast_to_bool(&local_70);
  this_local._4_4_ = (ER)bVar2;
  slang::ConstantValue::~ConstantValue(&local_70);
  return this_local._4_4_;
}

Assistant:

ER ExpressionStatement::evalImpl(EvalContext& context) const {
    // Skip system task invocations.
    if (expr.kind == ExpressionKind::Call && expr.as<CallExpression>().isSystemCall() &&
        expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task) {
        context.addDiag(diag::ConstSysTaskIgnored, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
        return ER::Success;
    }

    return expr.eval(context) ? ER::Success : ER::Fail;
}